

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS TestInvalidValues(_Bool IsJson5)

{
  JlDataObject *pJVar1;
  JlDataObject *pJVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  JL_STATUS JVar10;
  JL_STATUS JVar11;
  undefined7 in_register_00000039;
  size_t errorAtPos;
  JlDataObject *object;
  WJTL_STATUS local_4c;
  size_t local_48;
  size_t local_40;
  JlDataObject *local_38;
  
  WVar3 = VerifyJsonUnableToParse(IsJson5,"  StringWithNoQuotes",2);
  local_4c = WVar3;
  if (WVar3 != WJTL_STATUS_SUCCESS) {
    local_4c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  StringWithNoQuotes\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x437);
  if ((int)CONCAT71(in_register_00000039,IsJson5) == 0) {
    WVar3 = VerifyJsonUnableToParse(false,"  +1234",2);
    WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  +1234\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43a);
    WVar4 = VerifyJsonUnableToParse(false,"  .1234",2);
    WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  .1234\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43b);
    WVar5 = VerifyJsonUnableToParse(false,"  1234.",2);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  1234.\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43c);
    WVar6 = VerifyJsonUnableToParse(false,"  inf",2);
    WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43d);
    WVar7 = VerifyJsonUnableToParse(false,"  +inf",2);
    WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  +inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43e);
    WVar8 = VerifyJsonUnableToParse(false,"  -inf",2);
    WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  -inf\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x43f);
    WVar9 = VerifyJsonUnableToParse(false,"  -nan",2);
    WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  -nan\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x440);
    if (((WVar7 != WJTL_STATUS_SUCCESS || WVar8 != WJTL_STATUS_SUCCESS) ||
        ((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
        (WVar4 != WJTL_STATUS_SUCCESS || WVar3 != WJTL_STATUS_SUCCESS))) ||
        WVar9 != WJTL_STATUS_SUCCESS) {
      local_4c = WJTL_STATUS_FAILED;
    }
  }
  WVar4 = VerifyJsonUnableToParse(IsJson5,"  1.2.3",2);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  1.2.3\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x442);
  WVar5 = VerifyJsonUnableToParse(IsJson5,"  $",2);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  $\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x443);
  WVar6 = VerifyJsonUnableToParse(IsJson5,"  <>",2);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  <>\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x444);
  WVar7 = VerifyJsonUnableToParse(IsJson5,"  !",2);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  !\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x445);
  WVar8 = VerifyJsonUnableToParse(IsJson5,"  # Comment",2);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  # Comment\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x446);
  WVar3 = WJTL_STATUS_FAILED;
  if (((WVar6 == WJTL_STATUS_SUCCESS && WVar7 == WJTL_STATUS_SUCCESS) &&
      (WVar5 == WJTL_STATUS_SUCCESS && WVar4 == WJTL_STATUS_SUCCESS)) &&
      WVar8 == WJTL_STATUS_SUCCESS) {
    WVar3 = local_4c;
  }
  if (!IsJson5) {
    WVar4 = VerifyJsonUnableToParse(false,"  // Comment",2);
    WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  // Comment\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x449);
    WVar5 = VerifyJsonUnableToParse(false,"  /* Comment */",2);
    WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"  /* Comment */\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestInvalidValues",0x44a);
    if (WVar5 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) {
      WVar3 = WJTL_STATUS_FAILED;
    }
  }
  local_38 = (JlDataObject *)0x0;
  local_48 = 100;
  JVar10 = JlParseJsonEx(anon_var_dwarf_429 + 10,IsJson5,&local_38,&local_48);
  WjTestLib_Assert(JVar10 == JL_STATUS_END_OF_DATA,
                   "(JlParseJsonEx( \"\", IsJson5, &object, &errorAtPos )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x450);
  pJVar1 = local_38;
  WjTestLib_Assert(local_38 == (JlDataObject *)0x0,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x451);
  local_40 = local_48;
  WjTestLib_Assert(local_48 == 0,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x452);
  JVar11 = JlParseJsonEx("    ",IsJson5,&local_38,&local_48);
  WjTestLib_Assert(JVar11 == JL_STATUS_END_OF_DATA,
                   "(JlParseJsonEx( \"    \", IsJson5, &object, &errorAtPos )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x454);
  pJVar2 = local_38;
  WjTestLib_Assert(local_38 == (JlDataObject *)0x0,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x455);
  if (pJVar2 != (JlDataObject *)0x0 || local_48 != 0) {
    WVar3 = WJTL_STATUS_FAILED;
  }
  if (JVar11 != JL_STATUS_END_OF_DATA) {
    WVar3 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 != (JlDataObject *)0x0 || local_40 != 0) {
    WVar3 = WJTL_STATUS_FAILED;
  }
  if (JVar10 != JL_STATUS_END_OF_DATA) {
    WVar3 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(local_48 == 0,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestInvalidValues",0x456);
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestInvalidValues
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  StringWithNoQuotes", 2 ) );
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  +1234", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  .1234", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  1234.", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  +inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  -inf", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  -nan", 2 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  1.2.3", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  $", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  <>", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  !", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  # Comment", 2 ) );
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  // Comment", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "  /* Comment */", 2 ) );
    }

    // Empty objects
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    JL_ASSERT_STATUS( JlParseJsonEx( "", IsJson5, &object, &errorAtPos ), JL_STATUS_END_OF_DATA );
    JL_ASSERT_NULL( object );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT_STATUS( JlParseJsonEx( "    ", IsJson5, &object, &errorAtPos ), JL_STATUS_END_OF_DATA );
    JL_ASSERT_NULL( object );
    JL_ASSERT( 0 == errorAtPos );

    return TestReturn;
}